

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::doReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *src,int32_t srcStart,
          int32_t srcLength)

{
  int32_t length_00;
  int32_t start_00;
  char16_t *srcChars;
  UnicodeString *pUVar1;
  int32_t local_28;
  int32_t local_24;
  int32_t srcLength_local;
  int32_t srcStart_local;
  UnicodeString *src_local;
  int32_t length_local;
  int32_t start_local;
  UnicodeString *this_local;
  
  local_28 = srcLength;
  local_24 = srcStart;
  _srcLength_local = src;
  src_local._0_4_ = length;
  src_local._4_4_ = start;
  _length_local = this;
  pinIndices(src,&local_24,&local_28);
  start_00 = src_local._4_4_;
  length_00 = (int32_t)src_local;
  srcChars = getArrayStart(_srcLength_local);
  pUVar1 = doReplace(this,start_00,length_00,srcChars,local_24,local_28);
  return pUVar1;
}

Assistant:

UnicodeString&
UnicodeString::doReplace( int32_t start,
              int32_t length,
              const UnicodeString& src,
              int32_t srcStart,
              int32_t srcLength)
{
  // pin the indices to legal values
  src.pinIndices(srcStart, srcLength);

  // get the characters from src
  // and replace the range in ourselves with them
  return doReplace(start, length, src.getArrayStart(), srcStart, srcLength);
}